

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NodeImpl.cc
# Opt level: O0

void __thiscall avro::NodeArray::printJson(NodeArray *this,ostream *os,int depth)

{
  ostream *poVar1;
  shared_ptr<avro::Node> *this_00;
  type pNVar2;
  int in_EDX;
  ostream *in_RSI;
  size_t in_stack_00000008;
  SingleAttribute<boost::shared_ptr<avro::Node>_> *in_stack_00000010;
  ostream *in_stack_ffffffffffffffd8;
  indent local_20;
  indent in_stack_ffffffffffffffe4;
  indent local_18;
  int local_14;
  ostream *local_10;
  
  local_14 = in_EDX;
  local_10 = in_RSI;
  std::operator<<(in_RSI,"{\n");
  indent::indent(&local_18,local_14 + 1);
  poVar1 = avro::operator<<(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffe4);
  std::operator<<(poVar1,"\"type\": \"array\",\n");
  indent::indent((indent *)&stack0xffffffffffffffe4,local_14 + 1);
  poVar1 = avro::operator<<(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffe4);
  std::operator<<(poVar1,"\"items\": ");
  this_00 = concepts::SingleAttribute<boost::shared_ptr<avro::Node>_>::get
                      (in_stack_00000010,in_stack_00000008);
  pNVar2 = boost::shared_ptr<avro::Node>::operator->(this_00);
  (*pNVar2->_vptr_Node[0xd])(pNVar2,local_10,(ulong)(local_14 + 1));
  std::operator<<(local_10,'\n');
  indent::indent(&local_20,local_14);
  poVar1 = avro::operator<<(local_10,in_stack_ffffffffffffffe4);
  std::operator<<(poVar1,'}');
  return;
}

Assistant:

void 
NodeArray::printJson(std::ostream &os, int depth) const
{
    os << "{\n";
    os << indent(depth+1) << "\"type\": \"array\",\n";
    os << indent(depth+1) <<  "\"items\": ";
    leafAttributes_.get()->printJson(os, depth+1);
    os << '\n';
    os << indent(depth) << '}';
}